

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::StructLayout::HoleSet<unsigned_int>::addHolesAtEnd
          (HoleSet<unsigned_int> *this,uint lgSize,uint offset,uint limitLgSize)

{
  size_t sVar1;
  Fault local_48;
  Fault f_2;
  Fault f_1;
  Fault local_28;
  Fault f;
  uint local_18;
  uint limitLgSize_local;
  uint offset_local;
  uint lgSize_local;
  HoleSet<unsigned_int> *this_local;
  
  f.exception._4_4_ = limitLgSize;
  sVar1 = kj::size<unsigned_int,6ul>(this->holes);
  local_18 = offset;
  limitLgSize_local = lgSize;
  if (sVar1 < limitLgSize) {
    kj::_::Debug::Fault::Fault
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x70,FAILED,"limitLgSize <= kj::size(holes)","");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  while( true ) {
    if (f.exception._4_4_ <= limitLgSize_local) {
      return;
    }
    if (this->holes[limitLgSize_local] != 0) break;
    if ((local_18 & 1) != 1) {
      kj::_::Debug::Fault::Fault
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x74,FAILED,"offset % 2 == 1","");
      kj::_::Debug::Fault::fatal(&local_48);
    }
    this->holes[limitLgSize_local] = local_18;
    limitLgSize_local = limitLgSize_local + 1;
    local_18 = local_18 + 1 >> 1;
  }
  kj::_::Debug::Fault::Fault
            (&f_2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x73,FAILED,"holes[lgSize] == 0","");
  kj::_::Debug::Fault::fatal(&f_2);
}

Assistant:

void addHolesAtEnd(UIntType lgSize, UIntType offset,
                       UIntType limitLgSize = sizeof(HoleSet::holes) / sizeof(HoleSet::holes[0])) {
      // Add new holes of progressively larger sizes in the range [lgSize, limitLgSize) starting
      // from the given offset.  The idea is that you just allocated an lgSize-sized field from
      // an limitLgSize-sized space, such as a newly-added word on the end of the data segment.

      KJ_DREQUIRE(limitLgSize <= kj::size(holes));

      while (lgSize < limitLgSize) {
        KJ_DREQUIRE(holes[lgSize] == 0);
        KJ_DREQUIRE(offset % 2 == 1);
        holes[lgSize] = offset;
        ++lgSize;
        offset = (offset + 1) / 2;
      }
    }